

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals2
          (SPxSolverBase<double> *this,int leaveIdx,double enterMax,double *leavebound,
          StableSum<double> *objChange)

{
  int iVar1;
  Status SVar2;
  Status *pSVar3;
  VectorBase<double> *pVVar4;
  pointer pdVar5;
  SPxInternalCodeException *pSVar6;
  long lVar7;
  double dVar8;
  allocator local_61;
  double local_60;
  string local_58;
  SPxId leftId;
  
  leftId.super_DataKey = (this->super_SPxBasisBase<double>).theBaseId.data[leaveIdx].super_DataKey;
  local_60 = enterMax;
  if (leftId.super_DataKey.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,&leftId);
    iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_58);
    lVar7 = (long)iVar1;
    switch((this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar7]) {
    case D_FREE:
      pVVar4 = &this->theLBbound;
      if (local_60 *
          (this->theFvec->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[leaveIdx] < 0.0) {
        pVVar4 = &this->theUBbound;
      }
      dVar8 = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      dVar8 = *leavebound;
      (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      StableSum<double>::operator+=
                (objChange,
                 dVar8 * (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[leaveIdx]);
      pSVar3 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001906f3;
    case D_ON_UPPER:
      goto switchD_00190405_caseD_2;
    case D_ON_LOWER:
switchD_00190405_caseD_4:
      dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      StableSum<double>::operator+=
                (objChange,
                 *leavebound *
                 (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[leaveIdx]);
      pSVar3 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001905fc;
    case D_ON_BOTH:
      if (0.0 <= local_60 *
                 (this->theFvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[leaveIdx]) goto switchD_00190405_caseD_4;
      goto switchD_00190405_caseD_2;
    case D_UNDEFINED:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XENTER06 This should never happen.",&local_61);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_FIXED:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XENTER04 This should never happen.",&local_61);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XENTER07 This should never happen.",&local_61);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      pdVar5 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      pdVar5 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_58,"XENTER05 This should never happen.",&local_61);
      SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
      __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar5[lVar7] = dVar8;
    SVar2 = SPxBasisBase<double>::dualRowStatus(&this->super_SPxBasisBase<double>,iVar1);
    (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar7] = SVar2;
    if (SVar2 == D_ON_BOTH) {
      StableSum<double>::operator+=
                (objChange,
                 (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] *
                 (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar7]);
    }
    else if (SVar2 != D_ON_LOWER) {
      if (SVar2 != D_ON_UPPER) {
        return;
      }
      dVar8 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      goto LAB_001907e7;
    }
    dVar8 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    goto LAB_001907e7;
  }
  SPxColId::SPxColId((SPxColId *)&local_58,&leftId);
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set,(DataKey *)&local_58);
  pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
  lVar7 = (long)iVar1;
  switch(pSVar3[lVar7]) {
  case D_FREE:
    pVVar4 = &this->theUBbound;
    if (0.0 < local_60 *
              (this->theFvec->thedelta).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[leaveIdx]) {
      pVVar4 = &this->theLBbound;
    }
    dVar8 = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    StableSum<double>::operator+=
              (objChange,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7] * *leavebound);
    pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001906f3:
    pSVar3[lVar7] = P_FIXED;
    return;
  case D_ON_LOWER:
switchD_00190360_caseD_4:
    dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    StableSum<double>::operator+=
              (objChange,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7] * *leavebound);
    pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001905fc:
    pSVar3[lVar7] = P_ON_UPPER;
    return;
  case D_ON_BOTH:
  case D_UNDEFINED:
    if (local_60 *
        (this->theFvec->thedelta).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [leaveIdx] < 0.0) goto switchD_00190360_caseD_4;
  case D_ON_UPPER:
    dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    StableSum<double>::operator+=
              (objChange,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7] * *leavebound);
    pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001905af:
    pSVar3[lVar7] = P_ON_LOWER;
    return;
  case P_FIXED:
    pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_58,"XENTER08 This should never happen.",&local_61)
    ;
    SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
    __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_58,"XENTER09 This should never happen.",&local_61)
    ;
    SPxInternalCodeException::SPxInternalCodeException(pSVar6,&local_58);
    __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    pdVar5 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    pdVar5 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    local_60 = local_60 *
               (this->theFvec->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx];
    pVVar4 = &this->theUBbound;
    if (0.0 < local_60) {
      pVVar4 = &this->theLBbound;
    }
    dVar8 = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    pVVar4 = &this->theLCbound;
    if (local_60 <= 0.0) {
      pVVar4 = &this->theUCbound;
    }
    *leavebound = dVar8;
    (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    pSVar3[lVar7] = D_UNDEFINED;
    return;
  }
  pdVar5[lVar7] = dVar8;
  SVar2 = SPxBasisBase<double>::dualColStatus(&this->super_SPxBasisBase<double>,iVar1);
  (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar7] = SVar2;
  if (SVar2 == D_ON_BOTH) {
    StableSum<double>::operator+=
              (objChange,
               (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] *
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7]);
  }
  else {
    if (SVar2 == D_ON_LOWER) {
      dVar8 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      goto LAB_001907e7;
    }
    if (SVar2 != D_ON_UPPER) {
      return;
    }
  }
  dVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7];
  pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
LAB_001907e7:
  StableSum<double>::operator+=(objChange,dVar8 * pdVar5[lVar7]);
  return;
switchD_00190405_caseD_2:
  dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[leaveIdx];
  *leavebound = dVar8;
  (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar7] = dVar8;
  StableSum<double>::operator+=
            (objChange,
             *leavebound *
             (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[leaveIdx]);
  pSVar3 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
  goto LAB_001905af;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}